

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QWindow*,QGuiApplicationPrivate::SynthesizedMouseData>::
emplace<QGuiApplicationPrivate::SynthesizedMouseData_const&>
          (QHash<QWindow*,QGuiApplicationPrivate::SynthesizedMouseData> *this,QWindow **key,
          SynthesizedMouseData *args)

{
  Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_> *pDVar1;
  Data *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  SynthesizedMouseData local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_> **)
            this;
  if (pDVar1 == (Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>
                 *)0x0) {
    local_58.pos.xp = 0.0;
LAB_002de6e7:
    pDVar1 = (Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_> *)
             0x0;
LAB_002de708:
    pDVar1 = QHashPrivate::
             Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>::
             detached(pDVar1);
    *(Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_> **)this =
         pDVar1;
LAB_002de710:
    pVar3 = (piter)emplace_helper<QGuiApplicationPrivate::SynthesizedMouseData_const&>
                             (this,key,args);
    QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::~QHash
              ((QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *)&local_58);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_58.pos.xp = (qreal)pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>
                   **)this;
        if (pDVar1 == (Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>
                       *)0x0) goto LAB_002de6e7;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_002de708;
      goto LAB_002de710;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar3 = (piter)emplace_helper<QGuiApplicationPrivate::SynthesizedMouseData_const&>
                                 (this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_002de7b3;
    }
    local_58.pos.xp = (args->pos).xp;
    local_58.pos.yp = (args->pos).yp;
    local_58.screenPos.xp = (args->screenPos).xp;
    local_58.screenPos.yp = (args->screenPos).yp;
    local_58.window.wp.d = (args->window).wp.d;
    local_58.window.wp.value = (args->window).wp.value;
    if (local_58.window.wp.d != (Data *)0x0) {
      LOCK();
      ((local_58.window.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i =
           ((local_58.window.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pVar3 = (piter)QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::
                   emplace_helper<QGuiApplicationPrivate::SynthesizedMouseData>
                             ((QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *)this
                              ,key,&local_58);
    if (local_58.window.wp.d != (Data *)0x0) {
      LOCK();
      ((local_58.window.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i =
           ((local_58.window.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.window.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
        pDVar2 = local_58.window.wp.d;
        if (local_58.window.wp.d == (Data *)0x0) {
          pDVar2 = (Data *)0x0;
        }
        operator_delete(pDVar2);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_002de7b3:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }